

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode override_login(Curl_easy *data,connectdata *conn)

{
  bool bVar1;
  _Bool _Var2;
  NETRCcode ret_00;
  CURLcode CVar3;
  CURLUcode CVar4;
  char **passwordp;
  char **ppcVar5;
  char *pcVar6;
  char *local_70;
  CURLcode result_1;
  CURLcode result;
  char *m;
  NETRCcode ret;
  _Bool url_provided;
  char **optionsp;
  char **passwdp;
  char **userp;
  CURLUcode uc;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  passwdp = &conn->user;
  passwordp = &conn->passwd;
  ppcVar5 = &conn->options;
  if ((data->set).str[0x2f] != (char *)0x0) {
    (*Curl_cfree)(*ppcVar5);
    pcVar6 = (*Curl_cstrdup)((data->set).str[0x2f]);
    *ppcVar5 = pcVar6;
    if (*ppcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((data->set).use_netrc == '\x02') {
    (*Curl_cfree)(*passwdp);
    *passwdp = (char *)0x0;
    (*Curl_cfree)(*passwordp);
    *passwordp = (char *)0x0;
  }
  conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffff7ffff);
  if (((data->set).use_netrc != '\0') && ((data->set).str[0x2d] == (char *)0x0)) {
    bVar1 = false;
    if (((data->state).aptr.user != (char *)0x0) && ((*(uint *)&(data->state).field_0x7be & 3) != 3)
       ) {
      passwdp = &(data->state).aptr.user;
      bVar1 = true;
    }
    if (*passwordp == (char *)0x0) {
      ret_00 = Curl_parsenetrc(&(data->state).netrc,(conn->host).name,passwdp,passwordp,
                               (data->set).str[0x25]);
      if ((ret_00 == NETRC_OK) || ((ret_00 != NETRC_NO_MATCH && ((data->set).use_netrc != '\x01'))))
      {
        if (ret_00 != NETRC_OK) {
          pcVar6 = Curl_netrc_strerror(ret_00);
          Curl_failf(data,".netrc error: %s",pcVar6);
          return CURLE_READ_ERROR;
        }
        if (((conn->handler->flags & 0x2000) == 0) &&
           ((_Var2 = str_has_ctrl(*passwdp), _Var2 || (_Var2 = str_has_ctrl(*passwordp), _Var2)))) {
          Curl_failf(data,"control code detected in .netrc credentials");
          return CURLE_READ_ERROR;
        }
        conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffff7ffff | 0x80000);
      }
      else if (((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
        if ((data->set).str[0x25] == (char *)0x0) {
          local_70 = ".netrc";
        }
        else {
          local_70 = (data->set).str[0x25];
        }
        Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",(conn->host).name,
                   local_70);
      }
    }
    if (bVar1) {
      (*Curl_cfree)(conn->user);
      pcVar6 = (*Curl_cstrdup)(*passwdp);
      conn->user = pcVar6;
      if (conn->user == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((*passwdp == (char *)0x0) && (*passwordp != (char *)0x0)) {
      pcVar6 = (*Curl_cstrdup)("");
      *passwdp = pcVar6;
      if (*passwdp == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  if ((*passwdp != (char *)0x0) && ((data->state).aptr.user != *passwdp)) {
    CVar3 = Curl_setstropt(&(data->state).aptr.user,*passwdp);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xfffffffc | 3;
  }
  if ((data->state).aptr.user != (char *)0x0) {
    CVar4 = curl_url_set((data->state).uh,CURLUPART_USER,(data->state).aptr.user,0x80);
    if (CVar4 != CURLUE_OK) {
      CVar3 = Curl_uc_to_curlcode(CVar4);
      return CVar3;
    }
    if (*passwdp == (char *)0x0) {
      pcVar6 = (*Curl_cstrdup)((data->state).aptr.user);
      *passwdp = pcVar6;
      if (*passwdp == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  if (*passwordp != (char *)0x0) {
    CVar3 = Curl_setstropt(&(data->state).aptr.passwd,*passwordp);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xfffffffc | 3;
  }
  if ((data->state).aptr.passwd != (char *)0x0) {
    CVar4 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,(data->state).aptr.passwd,0x80);
    if (CVar4 != CURLUE_OK) {
      CVar3 = Curl_uc_to_curlcode(CVar4);
      return CVar3;
    }
    if (*passwordp == (char *)0x0) {
      pcVar6 = (*Curl_cstrdup)((data->state).aptr.passwd);
      *passwordp = pcVar6;
      if (*passwordp == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLUcode uc;
  char **userp = &conn->user;
  char **passwdp = &conn->passwd;
  char **optionsp = &conn->options;

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

#ifndef CURL_DISABLE_NETRC
  if(data->set.use_netrc == CURL_NETRC_REQUIRED) {
    Curl_safefree(*userp);
    Curl_safefree(*passwdp);
  }
  conn->bits.netrc = FALSE;
  if(data->set.use_netrc && !data->set.str[STRING_USERNAME]) {
    bool url_provided = FALSE;

    if(data->state.aptr.user &&
       (data->state.creds_from != CREDS_NETRC)) {
      /* there was a username with a length in the URL. Use the URL decoded
         version */
      userp = &data->state.aptr.user;
      url_provided = TRUE;
    }

    if(!*passwdp) {
      NETRCcode ret = Curl_parsenetrc(&data->state.netrc, conn->host.name,
                                      userp, passwdp,
                                      data->set.str[STRING_NETRC_FILE]);
      if(ret && ((ret == NETRC_NO_MATCH) ||
                 (data->set.use_netrc == CURL_NETRC_OPTIONAL))) {
        infof(data, "Couldn't find host %s in the %s file; using defaults",
              conn->host.name,
              (data->set.str[STRING_NETRC_FILE] ?
               data->set.str[STRING_NETRC_FILE] : ".netrc"));
      }
      else if(ret) {
        const char *m = Curl_netrc_strerror(ret);
        failf(data, ".netrc error: %s", m);
        return CURLE_READ_ERROR;
      }
      else {
        if(!(conn->handler->flags&PROTOPT_USERPWDCTRL)) {
          /* if the protocol can't handle control codes in credentials, make
             sure there are none */
          if(str_has_ctrl(*userp) || str_has_ctrl(*passwdp)) {
            failf(data, "control code detected in .netrc credentials");
            return CURLE_READ_ERROR;
          }
        }
        /* set bits.netrc TRUE to remember that we got the name from a .netrc
           file, so that it is safe to use even if we followed a Location: to a
           different host or similar. */
        conn->bits.netrc = TRUE;
      }
    }
    if(url_provided) {
      free(conn->user);
      conn->user = strdup(*userp);
      if(!conn->user)
        return CURLE_OUT_OF_MEMORY;
    }
    /* no user was set but a password, set a blank user */
    if(!*userp && *passwdp) {
      *userp = strdup("");
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
#endif

  /* for updated strings, we update them in the URL */
  if(*userp) {
    CURLcode result;
    if(data->state.aptr.user != *userp) {
      /* nothing to do then */
      result = Curl_setstropt(&data->state.aptr.user, *userp);
      if(result)
        return result;
      data->state.creds_from = CREDS_NETRC;
    }
  }
  if(data->state.aptr.user) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, data->state.aptr.user,
                      CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*userp) {
      *userp = strdup(data->state.aptr.user);
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  if(*passwdp) {
    CURLcode result = Curl_setstropt(&data->state.aptr.passwd, *passwdp);
    if(result)
      return result;
    data->state.creds_from = CREDS_NETRC;
  }
  if(data->state.aptr.passwd) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD,
                      data->state.aptr.passwd, CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*passwdp) {
      *passwdp = strdup(data->state.aptr.passwd);
      if(!*passwdp)
        return CURLE_OUT_OF_MEMORY;
    }
  }

  return CURLE_OK;
}